

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O0

bool __thiscall NJamSpell::TSpellCorrector::SaveCache(TSpellCorrector *this,string *cacheFile)

{
  byte bVar1;
  bool bVar2;
  pointer pTVar3;
  uint64_t local_238;
  undefined4 local_230;
  ostream local_220 [8];
  ofstream out;
  string *cacheFile_local;
  TSpellCorrector *this_local;
  
  std::ofstream::ofstream(local_220,(string *)cacheFile,_S_bin);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->Deletes1);
    if ((bVar2) &&
       (bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->Deletes2), bVar2)) {
      NHandyPack::Dump<unsigned_long>(local_220,&SPELL_CHECKER_CACHE_MAGIC_BYTE);
      NHandyPack::Dump<unsigned_short>(local_220,&SPELL_CHECKER_CACHE_VERSION);
      local_238 = TLangModel::GetCheckSum(&this->LangModel);
      NHandyPack::Dump<unsigned_long>(local_220,&local_238);
      pTVar3 = std::
               unique_ptr<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>::
               operator->(&this->Deletes1);
      TBloomFilter::Dump(pTVar3,local_220);
      pTVar3 = std::
               unique_ptr<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>::
               operator->(&this->Deletes2);
      TBloomFilter::Dump(pTVar3,local_220);
      NHandyPack::Dump<unsigned_long>(local_220,&SPELL_CHECKER_CACHE_MAGIC_BYTE);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  local_230 = 1;
  std::ofstream::~ofstream(local_220);
  return this_local._7_1_;
}

Assistant:

bool TSpellCorrector::SaveCache(const std::string& cacheFile) {
    std::ofstream out(cacheFile, std::ios::binary);
    if (!out.is_open()) {
        return false;
    }
    if (!Deletes1 || !Deletes2) {
        return false;
    }
    NHandyPack::Dump(out, SPELL_CHECKER_CACHE_MAGIC_BYTE);
    NHandyPack::Dump(out, SPELL_CHECKER_CACHE_VERSION);
    NHandyPack::Dump(out, LangModel.GetCheckSum());
    Deletes1->Dump(out);
    Deletes2->Dump(out);
    NHandyPack::Dump(out, SPELL_CHECKER_CACHE_MAGIC_BYTE);
    return true;
}